

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O1

ComponentHandle<Position,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<Position>(EntityManager *this,Id id)

{
  ulong *puVar1;
  ComponentHandle<Position,_entityx::EntityManager> CVar2;
  Family FVar3;
  Pool<Position,_8192UL> *pPVar4;
  ulong uVar5;
  ComponentHandle<Position,_entityx::EntityManager> component;
  Entity local_38;
  ComponentHandle<Position,_entityx::EntityManager> local_28;
  
  FVar3 = Component<Position>::family();
  pPVar4 = accomodate_component<Position>(this);
  uVar5 = id.id_ & 0xffffffff;
  *(undefined8 *)
   (*(long *)(*(long *)&pPVar4->field_0x8 + (uVar5 / *(ulong *)&pPVar4->field_0x28) * 8) +
   (uVar5 % *(ulong *)&pPVar4->field_0x28) * *(long *)&pPVar4->field_0x20) = 0;
  if (FVar3 < 0x40) {
    puVar1 = (ulong *)(*(long *)(this + 0x48) + uVar5 * 8);
    *puVar1 = *puVar1 | 1L << ((byte)FVar3 & 0x3f);
    local_38.manager_ = this;
    local_38.id_.id_ = id.id_;
    local_28.manager_ = this;
    local_28.id_.id_ = id.id_;
    EventManager::
    emit<entityx::ComponentAddedEvent<Position>,entityx::Entity,entityx::ComponentHandle<Position,entityx::EntityManager>&>
              (*(EventManager **)(this + 0x10),&local_38,&local_28);
    CVar2.id_.id_ = local_28.id_.id_;
    CVar2.manager_ = local_28.manager_;
    return CVar2;
  }
  std::__throw_out_of_range_fmt
            ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",FVar3,0x40);
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }